

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::WriteBuildEventsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccv,string *name,string *cmd)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  pointer pbVar3;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  string *psVar4;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *byp;
  pointer pbVar8;
  char *pcVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string fname;
  string fext;
  string shell;
  cmGeneratedFileStream f;
  cmCustomCommandGenerator ccg;
  undefined1 in_stack_fffffffffffffa30 [12];
  int val;
  pointer cc;
  string local_5b8;
  long *local_598 [2];
  long local_588 [2];
  string local_578;
  long *local_558;
  long local_550;
  long local_548 [2];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_538;
  bool local_518;
  long *local_510 [2];
  long local_500 [2];
  string *local_4f0;
  pointer local_4e8;
  string *local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  code *local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined1 *puStack_4b0;
  undefined1 local_4a8 [32];
  undefined8 local_488;
  undefined1 *local_480;
  undefined1 local_478 [32];
  undefined8 local_458;
  undefined1 *local_450;
  undefined1 local_448 [32];
  cmAlphaNum local_428;
  undefined1 local_3f8 [24];
  undefined1 *puStack_3e0;
  undefined8 local_3d8;
  long *local_3d0;
  undefined8 local_3c8;
  undefined1 *local_3c0;
  size_type local_3b8;
  pointer local_3b0;
  undefined8 local_3a8;
  undefined1 *local_3a0;
  size_type local_398;
  pointer local_390;
  size_t local_388;
  char *pcStack_380;
  undefined8 local_378;
  long *local_370;
  cmCustomCommandGenerator local_190;
  
  local_598[0] = local_588;
  local_4f0 = cmd;
  local_4e0 = name;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,".sh","");
  local_558 = local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"/bin/sh ","");
  cc = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_4e8 = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (cc != local_4e8) {
    val = 0;
    do {
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      pcVar1 = (this->ConfigName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_578,pcVar1,pcVar1 + (this->ConfigName)._M_string_length);
      local_518 = false;
      local_4d8 = 0;
      uStack_4d0 = 0;
      local_4c8 = (code *)0x0;
      uStack_4c0 = 0;
      computeInternalDepfile.super__Function_base._8_12_ = in_stack_fffffffffffffa30;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_4d8;
      computeInternalDepfile.super__Function_base._M_manager._4_4_ = val;
      computeInternalDepfile._M_invoker = (_Invoker_type)cc;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&local_190,cc,&local_578,&this->LocalGenerator->super_cmLocalGenerator,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_538,computeInternalDepfile);
      if (local_4c8 != (code *)0x0) {
        (*local_4c8)(&local_4d8,&local_4d8,3);
      }
      if (local_518 == true) {
        local_518 = false;
        if (local_538._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_538._M_value + 0x10))
        {
          operator_delete((void *)local_538._M_value._M_dataplus._M_p,local_538._16_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
      }
      psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                         (&this->LocalGenerator->super_cmLocalGenerator);
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      pp_Var2 = (_func_int **)psVar4->_M_string_length;
      local_4b8 = 1;
      puStack_4b0 = local_4a8;
      local_4a8[0] = 0x2f;
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                (local_510,this->LocalGenerator,this->GeneratorTarget);
      local_3f8._16_8_ = local_4b8;
      puStack_3e0 = puStack_4b0;
      local_3d8 = local_510[1];
      local_3d0 = local_510[0];
      local_458 = 1;
      local_450 = local_448;
      local_448[0] = 0x2f;
      local_3c8 = 1;
      local_3b0 = (this->Name)._M_dataplus._M_p;
      local_3b8 = (this->Name)._M_string_length;
      local_488 = 1;
      local_480 = local_478;
      local_478[0] = 0x5f;
      local_3a8 = 1;
      local_390 = (local_4e0->_M_dataplus)._M_p;
      local_398 = local_4e0->_M_string_length;
      local_3f8._0_8_ = pp_Var2;
      local_3f8._8_8_ = pcVar1;
      local_3c0 = local_450;
      local_3a0 = local_480;
      cmAlphaNum::cmAlphaNum(&local_428,val);
      local_388 = local_428.View_._M_len;
      pcStack_380 = local_428.View_._M_str;
      local_378 = local_598[1];
      local_370 = local_598[0];
      views._M_len = 9;
      views._M_array = (iterator)local_3f8;
      cmCatViews_abi_cxx11_(&local_5b8,views);
      if (local_510[0] != local_500) {
        operator_delete(local_510[0],local_500[0] + 1);
      }
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_3f8,&local_5b8,false,None);
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_3f8,true);
      WriteCustomCommandsHelper(this,(ostream *)local_3f8,&local_190);
      cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_3f8);
      if (this->TagType == CUSTOM_TARGET) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    :outputName=\"",0x12);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
        lVar7 = 7;
        pcVar9 = ".rule\"\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(fout,"    :",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,(local_4f0->_M_dataplus)._M_p,local_4f0->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=\"",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_558,local_550);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
        lVar7 = 2;
        pcVar9 = "\"\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar7);
      pvVar6 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&local_190);
      pbVar3 = (pvVar6->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (pvVar6->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar3;
          pbVar8 = pbVar8 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>(fout,"    :extraOutputFile=\"",0x16);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      val = val + 1;
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&local_190);
      cc = cc + 1;
    } while (cc != local_4e8);
  }
  if (local_558 != local_548) {
    operator_delete(local_558,local_548[0] + 1);
  }
  if (local_598[0] != local_588) {
    operator_delete(local_598[0],local_588[0] + 1);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteBuildEventsHelper(
  std::ostream& fout, const std::vector<cmCustomCommand>& ccv,
  std::string const& name, std::string const& cmd)
{
  int cmdcount = 0;
#ifdef _WIN32
  std::string fext = ".bat";
  std::string shell;
#else
  std::string fext = ".sh";
  std::string shell = "/bin/sh ";
#endif

  for (cmCustomCommand const& cc : ccv) {
    cmCustomCommandGenerator ccg(cc, this->ConfigName, this->LocalGenerator);
    // Open the filestream for this custom command
    std::string fname =
      cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
               this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
               '/', this->Name, '_', name, cmdcount++, fext);

    cmGeneratedFileStream f(fname);
    f.SetCopyIfDifferent(true);
    this->WriteCustomCommandsHelper(f, ccg);
    f.Close();
    if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
      fout << "    :" << cmd << "=\"" << shell << fname << "\"\n";
    } else {
      fout << fname << "\n    :outputName=\"" << fname << ".rule\"\n";
    }
    for (const auto& byp : ccg.GetByproducts()) {
      fout << "    :extraOutputFile=\"" << byp << "\"\n";
    }
  }
}